

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-take.c
# Opt level: O1

_Bool borg_flow_take_scum(_Bool viewable,wchar_t nearness)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc_conflict grid2;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  
  if ((borg_takes_cnt != 0) &&
     (borg_items[(int)(~borg.trait[0x9e] + (uint)z_info->pack_size)].iqty == '\0')) {
    borg_temp_n = 0;
    if (track_less.num < 1) {
      wVar4 = L'\xffffffff';
    }
    else {
      uVar8 = 0xffffffff;
      uVar5 = 0;
      wVar9 = L'\xffffffff';
      do {
        grid2 = loc(track_less.x[uVar5],track_less.y[uVar5]);
        wVar4 = distance(borg.c,grid2);
        wVar10 = wVar9;
        if (wVar9 <= wVar4) {
          wVar10 = wVar4;
        }
        if (wVar9 < wVar4) {
          uVar8 = uVar5 & 0xffffffff;
        }
        wVar4 = (wchar_t)uVar8;
        uVar5 = uVar5 + 1;
        wVar9 = wVar10;
      } while ((long)uVar5 < (long)track_less.num);
    }
    if (1 < borg_takes_nxt) {
      lVar6 = 1;
      lVar7 = 0x28;
      do {
        if ((*(long *)((long)borg_takes + lVar7 + -0x10) != 0) &&
           (0 < *(int *)((long)&borg_takes->kind + lVar7))) {
          bVar1 = *(byte *)((long)borg_takes + lVar7 + -4);
          bVar2 = *(byte *)((long)borg_takes + lVar7 + -3);
          if (((!viewable) || ((borg_grids[bVar2][bVar1].info & 0x20) != 0)) &&
             (_Var3 = borg_flow_far_from_stairs((uint)bVar1,(uint)bVar2,wVar4), !_Var3)) {
            borg_temp_x[borg_temp_n] = bVar1;
            borg_temp_y[borg_temp_n] = bVar2;
            borg_temp_n = borg_temp_n + 1;
          }
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x18;
      } while (lVar6 < borg_takes_nxt);
    }
    if (borg_temp_n != 0) {
      borg_flow_clear();
      if (0 < borg_temp_n) {
        lVar6 = 0;
        do {
          borg_flow_enqueue_grid((uint)borg_temp_y[lVar6],(uint)borg_temp_x[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < borg_temp_n);
      }
      borg_flow_spread(nearness,true,!viewable,false,L'\xffffffff',true);
      _Var3 = borg_flow_commit("Scum item",L'\x02');
      if (_Var3) {
        _Var3 = borg_flow_old(L'\x02');
        return _Var3;
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_take_scum(bool viewable, int nearness)
{
    int i, x, y;
    int j;
    int b_j     = -1;
    int b_stair = -1;

    borg_grid *ag;

    /* Efficiency -- Nothing to take */
    if (!borg_takes_cnt)
        return false;

    /* Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* Nothing yet */
    borg_temp_n = 0;

    /* Check distance away from stairs, used later */

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the object list -- set filter*/
    for (i = 1; i < borg_takes_nxt; i++) {
        borg_take *take = &borg_takes[i];

        /* Skip dead objects */
        if (!take->kind)
            continue;

        /* Access the location */
        x = take->x;
        y = take->y;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* skip worthless items */
        if (take->value <= 0)
            continue;

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to take */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to take */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward items that we can see, make sure they */
    /* are at least easily reachable.  The second flag is weather or not  */
    /* to avoid unknown squares.  This was for performance. */
    borg_flow_spread(nearness, true, !viewable, false, -1, true);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Scum item", GOAL_TAKE))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_TAKE))
        return false;

    /* Success */
    return true;
}